

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPulley.cpp
# Opt level: O3

void __thiscall chrono::ChLinkPulley::ArchiveIN(ChLinkPulley *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChFrame<double>_> specFuncA;
  char *local_58;
  double *local_50;
  undefined1 local_48;
  undefined **local_40;
  ChFrame<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::ChLinkPulley>(marchive);
  ChLinkLockLock::ArchiveIN(&this->super_ChLinkLockLock,marchive);
  local_50 = &this->tau;
  local_58 = "tau";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  local_50 = &this->phase;
  local_58 = "phase";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  local_50 = (double *)&this->checkphase;
  local_58 = "checkphase";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_58);
  local_50 = &this->a1;
  local_58 = "a1";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  local_50 = &this->a2;
  local_58 = "a2";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  local_50 = &this->r1;
  local_58 = "r1";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  local_50 = &this->r2;
  local_58 = "r2";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  local_38 = &this->local_shaft1;
  local_58 = "local_shaft1";
  local_48 = 0;
  local_40 = &PTR__ChFunctorArchiveIn_00b113c0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->local_shaft2;
  local_40 = &PTR__ChFunctorArchiveIn_00b113c0;
  local_58 = "local_shaft2";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  return;
}

Assistant:

void ChLinkPulley::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkPulley>();

    // deserialize parent class
    ChLinkLockLock::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(tau);
    marchive >> CHNVP(phase);
    marchive >> CHNVP(checkphase);
    marchive >> CHNVP(a1);
    marchive >> CHNVP(a2);
    marchive >> CHNVP(r1);
    marchive >> CHNVP(r2);
    marchive >> CHNVP(local_shaft1);
    marchive >> CHNVP(local_shaft2);
}